

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar_p.h
# Opt level: O2

void __thiscall QToolBarPrivate::QToolBarPrivate(QToolBarPrivate *this)

{
  QWidgetPrivate::QWidgetPrivate(&this->super_QWidgetPrivate,QObjectPrivateVersion);
  *(undefined ***)&this->super_QWidgetPrivate = &PTR__QToolBarPrivate_007d7e60;
  *(undefined4 *)&(this->super_QWidgetPrivate).field_0x254 = 0x1010000;
  this->allowedAreas = (QFlagsStorageHelper<Qt::ToolBarArea,_4>)0xf;
  this->orientation = Horizontal;
  this->toolButtonStyle = ToolButtonIconOnly;
  (this->iconSize).wd = -1;
  (this->iconSize).ht.m_i = -1;
  this->layout = (QToolBarLayout *)0x0;
  this->state = (DragState *)0x0;
  (this->waitForPopupTimer).m_id = Invalid;
  return;
}

Assistant:

inline QToolBarPrivate()
        : explicitIconSize(false), explicitToolButtonStyle(false), movable(true), floatable(true),
          allowedAreas(Qt::AllToolBarAreas), orientation(Qt::Horizontal),
          toolButtonStyle(Qt::ToolButtonIconOnly),
          layout(nullptr), state(nullptr)
#ifdef Q_OS_MACOS
        , macWindowDragging(false)
#endif
    { }